

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMemShallowCopy(Mem *pTo,Mem *pFrom,int srcType)

{
  undefined2 uVar1;
  sqlite3 *psVar2;
  char *pcVar3;
  anon_union_8_5_44880d43_for_u aVar4;
  u16 uVar5;
  u8 uVar6;
  u8 uVar7;
  
  if ((pTo->flags & 0x2460) != 0) {
    sqlite3VdbeMemReleaseExternal(pTo);
  }
  uVar5 = pFrom->flags;
  uVar6 = pFrom->type;
  uVar7 = pFrom->enc;
  pTo->n = pFrom->n;
  pTo->flags = uVar5;
  pTo->type = uVar6;
  pTo->enc = uVar7;
  psVar2 = pFrom->db;
  pcVar3 = pFrom->z;
  aVar4 = pFrom->u;
  pTo->r = pFrom->r;
  pTo->u = aVar4;
  pTo->db = psVar2;
  pTo->z = pcVar3;
  pTo->xDel = (_func_void_void_ptr *)0x0;
  if ((pFrom->flags & 0x800) == 0) {
    uVar1 = pTo->flags;
    pTo->flags = uVar1 & 0xe3ff | (ushort)srcType;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemShallowCopy(Mem *pTo, const Mem *pFrom, int srcType){
  assert( (pFrom->flags & MEM_RowSet)==0 );
  VdbeMemRelease(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->xDel = 0;
  if( (pFrom->flags&MEM_Static)==0 ){
    pTo->flags &= ~(MEM_Dyn|MEM_Static|MEM_Ephem);
    assert( srcType==MEM_Ephem || srcType==MEM_Static );
    pTo->flags |= srcType;
  }
}